

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

void celero::executor::Run(shared_ptr<celero::Benchmark> *bmark)

{
  bool bVar1;
  shared_ptr<celero::Benchmark> local_30;
  shared_ptr<celero::Benchmark> local_20;
  
  local_20.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (bmark->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (bmark->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_20.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_20.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  bVar1 = RunBaseline(&local_20);
  if (local_20.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar1) {
    local_30.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (bmark->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_30.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (bmark->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_30.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_30.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_30.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    RunExperiments(&local_30);
    if (local_30.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      return;
    }
  }
  return;
}

Assistant:

void executor::Run(std::shared_ptr<Benchmark> bmark)
{
	if(executor::RunBaseline(bmark) == true)
	{
		executor::RunExperiments(bmark);
	}
}